

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void get_extension(char *file_name,char *extension)

{
  char *pcVar1;
  size_t sVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  sVar2 = strlen(file_name);
  lVar6 = 0;
  pcVar1 = file_name + sVar2;
  while( true ) {
    pcVar4 = pcVar1 + -1;
    if (pcVar4 < file_name) goto LAB_00109416;
    if (*pcVar4 == '.') break;
    lVar6 = lVar6 + -1;
    pcVar1 = pcVar4;
  }
  for (lVar5 = 0; -lVar5 != lVar6; lVar5 = lVar5 + 1) {
    pp_Var3 = __ctype_tolower_loc();
    extension[lVar5] = (char)(*pp_Var3)[pcVar1[lVar5]];
  }
  extension = extension + -lVar6;
LAB_00109416:
  *extension = '\0';
  return;
}

Assistant:

static void get_extension(const char *file_name, char *extension)
{
    size_t length = strlen(file_name);
    size_t ext_len = 0;
    size_t i = 0;
    const char *p = file_name + length - 1;

    while (p >= file_name) {
        if (p[0] == '.') {
            for (i = 0; i < ext_len; i++)
                extension[i] = tolower(p[i + 1]);

            extension[i] = '\0';
            return ;
        }
        ext_len++;
        p--;
    }

    extension[0] = '\0';
}